

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *this,
          MinimalityCheck *x)

{
  bool bVar1;
  MinimalityCheck *pMVar2;
  FwdCheck FVar3;
  MinimalityCheck *in_RSI;
  MinimalityCheck *in_RDI;
  DeleteObject deleter;
  
  pMVar2 = get((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *
               )0x214096);
  if ((in_RSI != pMVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject>
                        *)0x2140ac), bVar1)) {
    release((SingleOwnerPtr<Clasp::DefaultUnfoundedCheck::MinimalityCheck,_Clasp::DeleteObject> *)
            in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  FVar3 = (FwdCheck)set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->fwd = FVar3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}